

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  value_type *pvVar4;
  ImGuiContext *g;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  while( true ) {
    pIVar3 = GImGui;
    pIVar1 = GImGui->CurrentWindow;
    pIVar1->Accessed = true;
    if (column_index < 0) {
      column_index = (pIVar1->DC).ColumnsCurrent;
    }
    if ((pIVar1->DC).ColumnsData.Size <= column_index) {
      __assert_fail("column_index < window->DC.ColumnsData.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                    ,0x277b,"void ImGui::SetColumnOffset(int, float)");
    }
    uVar5 = (pIVar1->DC).ColumnsFlags;
    if (((uVar5 & 4) == 0) && (column_index < (pIVar1->DC).ColumnsCount + -1)) {
      fVar6 = GetColumnWidth(column_index);
      uVar5 = (pIVar1->DC).ColumnsFlags;
      bVar2 = true;
    }
    else {
      fVar6 = 0.0;
      bVar2 = false;
    }
    fVar8 = (pIVar1->DC).ColumnsMaxX;
    if (((uVar5 & 8) == 0) &&
       (fVar7 = fVar8 - (float)((pIVar1->DC).ColumnsCount - column_index) *
                        (pIVar3->Style).ColumnsMinSpacing, fVar7 <= offset)) {
      offset = fVar7;
    }
    fVar7 = (pIVar1->DC).ColumnsMinX;
    fVar8 = (offset - fVar7) / (fVar8 - fVar7);
    ImGuiStorage::SetFloat((pIVar1->DC).StateStorage,(pIVar1->DC).ColumnsSetId + column_index,fVar8)
    ;
    pvVar4 = ImVector<ImGuiColumnData>::operator[](&(pIVar1->DC).ColumnsData,column_index);
    pvVar4->OffsetNorm = fVar8;
    if (!bVar2) break;
    column_index = column_index + 1;
    fVar8 = (pIVar3->Style).ColumnsMinSpacing;
    uVar5 = -(uint)(fVar6 <= fVar8);
    offset = offset + (float)(~uVar5 & (uint)fVar6 | (uint)fVar8 & uVar5);
  }
  return;
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);

    const bool preserve_width = !(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < window->DC.ColumnsCount-1);
    const float width = preserve_width ? GetColumnWidth(column_index) : 0.0f;

    if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, window->DC.ColumnsMaxX - g.Style.ColumnsMinSpacing * (window->DC.ColumnsCount - column_index));
    const float offset_norm = PixelsToOffsetNorm(window, offset);

    const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
    window->DC.StateStorage->SetFloat(column_id, offset_norm);
    window->DC.ColumnsData[column_index].OffsetNorm = offset_norm;

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}